

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_convert_db.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  DatabaseInterface *pDVar5;
  DatabaseInterface *pDVar6;
  char *pcVar7;
  unsigned_long *hash;
  pointer puVar8;
  char *__format;
  uint i;
  uint uVar9;
  bool bVar10;
  allocator_type local_89;
  DatabaseInterface *local_88;
  size_t hash_count;
  DatabaseInterface *local_78;
  size_t blob_size;
  pointer local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> blob;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  
  if (argc != 3) {
    fwrite("Fossilize INFO: Usage: fossilize-convert-db input-db output-db\n",0x3f,1,_stderr);
    return 1;
  }
  pDVar5 = Fossilize::create_database(argv[1],ReadOnly);
  pDVar6 = Fossilize::create_database(argv[2],OverWrite);
  local_88 = pDVar5;
  local_78 = pDVar6;
  if ((pDVar5 == (DatabaseInterface *)0x0) ||
     (iVar2 = (*pDVar5->_vptr_DatabaseInterface[2])(pDVar5), (char)iVar2 == '\0')) {
    pcVar7 = argv[1];
    __format = "Fossilize ERROR: Failed to load database: %s\n";
  }
  else {
    if ((pDVar6 != (DatabaseInterface *)0x0) &&
       (iVar2 = (*pDVar6->_vptr_DatabaseInterface[2])(pDVar6), (char)iVar2 != '\0')) {
      uVar9 = 0;
      iVar2 = 0;
      do {
        pDVar5 = local_88;
        if (uVar9 == 10) break;
        hash_count = 0;
        iVar3 = (*local_88->_vptr_DatabaseInterface[6])(local_88,(ulong)uVar9,&hash_count,0);
        if ((char)iVar3 == '\0') goto LAB_00104a2f;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&hashes,hash_count,(allocator_type *)&blob);
        iVar3 = (*pDVar5->_vptr_DatabaseInterface[6])(pDVar5,(ulong)uVar9,&hash_count);
        if ((char)iVar3 == '\0') {
LAB_001049c4:
          bVar10 = false;
          iVar2 = 1;
        }
        else {
          local_68 = hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          puVar8 = hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            pDVar5 = local_88;
            bVar10 = puVar8 == local_68;
            if (bVar10) break;
            blob_size = 0;
            iVar3 = (*local_88->_vptr_DatabaseInterface[3])
                              (local_88,(ulong)uVar9,*puVar8,&blob_size,0,0);
            if ((char)iVar3 == '\0') goto LAB_001049c4;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      (&blob,blob_size,&local_89);
            cVar1 = '\0';
            iVar4 = (*pDVar5->_vptr_DatabaseInterface[3])(pDVar5,(ulong)uVar9,*puVar8);
            iVar3 = 1;
            if ((char)iVar4 != '\0') {
              iVar3 = (*local_78->_vptr_DatabaseInterface[4])(local_78,(ulong)uVar9,*puVar8);
              cVar1 = (char)iVar3;
              iVar3 = iVar2;
              if (cVar1 == '\0') {
                iVar3 = 1;
              }
            }
            iVar2 = iVar3;
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&blob.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
            puVar8 = puVar8 + 1;
          } while (cVar1 != '\0');
        }
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        uVar9 = uVar9 + 1;
      } while (bVar10);
      goto LAB_00104a33;
    }
    pcVar7 = argv[2];
    __format = "Fossilize ERROR: Failed to open database for writing: %s\n";
  }
  fprintf(_stderr,__format,pcVar7);
LAB_00104a2f:
  iVar2 = 1;
LAB_00104a33:
  if (local_78 != (DatabaseInterface *)0x0) {
    (*local_78->_vptr_DatabaseInterface[1])();
  }
  if (local_88 != (DatabaseInterface *)0x0) {
    (*local_88->_vptr_DatabaseInterface[1])();
  }
  return iVar2;
}

Assistant:

int main(int argc, char *argv[])
{
	if (argc != 3)
	{
		print_help();
		return EXIT_FAILURE;
	}

	auto input_db = std::unique_ptr<DatabaseInterface>(create_database(argv[1], DatabaseMode::ReadOnly));
	auto output_db = std::unique_ptr<DatabaseInterface>(create_database(argv[2], DatabaseMode::OverWrite));
	if (!input_db || !input_db->prepare())
	{
		LOGE("Failed to load database: %s\n", argv[1]);
		return EXIT_FAILURE;
	}

	if (!output_db || !output_db->prepare())
	{
		LOGE("Failed to open database for writing: %s\n", argv[2]);
		return EXIT_FAILURE;
	}

	for (unsigned i = 0; i < RESOURCE_COUNT; i++)
	{
		auto tag = static_cast<ResourceTag>(i);

		size_t hash_count = 0;
		if (!input_db->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
			return EXIT_FAILURE;
		std::vector<Hash> hashes(hash_count);
		if (!input_db->get_hash_list_for_resource_tag(tag, &hash_count, hashes.data()))
			return EXIT_FAILURE;

		for (auto &hash : hashes)
		{
			size_t blob_size = 0;
			if (!input_db->read_entry(tag, hash, &blob_size, nullptr, PAYLOAD_READ_NO_FLAGS))
				return EXIT_FAILURE;
			std::vector<uint8_t> blob(blob_size);
			if (!input_db->read_entry(tag, hash, &blob_size, blob.data(), PAYLOAD_READ_NO_FLAGS))
				return EXIT_FAILURE;

			if (!output_db->write_entry(tag, hash, blob.data(), blob.size(),
					PAYLOAD_WRITE_COMPUTE_CHECKSUM_BIT |
					PAYLOAD_WRITE_COMPRESS_BIT |
					PAYLOAD_WRITE_BEST_COMPRESSION_BIT))
			{
				return EXIT_FAILURE;
			}
		}
	}
}